

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

bool __thiscall
cmComputeLinkInformation::AddLibraryFeature(cmComputeLinkInformation *this,string *feature)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmGlobalGenerator *pcVar4;
  cmLocalGenerator *pcVar5;
  cmake *pcVar6;
  pointer pBVar7;
  cmComputeLinkInformation *pcVar8;
  bool bVar9;
  iterator iVar10;
  cmValue cVar11;
  long lVar12;
  string *psVar13;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar14;
  _Alloc_hider _Var15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  undefined1 local_280 [48];
  string *local_250;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  items;
  undefined1 local_230 [16];
  undefined1 local_220 [32];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  _Base_ptr local_1e0;
  undefined1 local_1d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  cmComputeLinkInformation *local_188;
  undefined1 local_180 [16];
  string featureName;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  undefined1 local_130 [32];
  string local_110;
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  string local_b0;
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  this_00 = &this->LibraryFeatureDescriptors;
  iVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
           ::find(&this_00->_M_t,feature);
  if ((_Rb_tree_header *)iVar10._M_node !=
      &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
    return (bool)(char)iVar10._M_node[3]._M_color;
  }
  local_220._8_8_ = (this->LinkLanguage)._M_dataplus._M_p;
  local_220._0_8_ = (this->LinkLanguage)._M_string_length;
  local_230._0_8_ = (element_type *)0x6;
  local_230._8_8_ = "CMAKE_";
  local_220._16_8_ = &DAT_00000014;
  local_220._24_8_ = (long)"CMAKE_LINK_LIBRARY_USING_" + 5;
  local_200._8_8_ = (feature->_M_dataplus)._M_p;
  local_200._0_8_ = feature->_M_string_length;
  views._M_len = 4;
  views._M_array = (iterator)local_230;
  local_250 = feature;
  cmCatViews_abi_cxx11_(&featureName,views);
  pcVar2 = this->Makefile;
  local_230._0_8_ = featureName._M_string_length;
  local_230._8_8_ = featureName._M_dataplus._M_p;
  local_220._0_8_ = (cmLocalGenerator *)0xa;
  local_220._8_8_ = (long)"CMAKE_CUDA_PIE_SUPPORTED" + 0xe;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_230;
  cmCatViews_abi_cxx11_((string *)local_280,views_00);
  cVar11 = cmMakefile::GetDefinition(pcVar2,(string *)local_280);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_280 + 0x10);
  pcVar14 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._0_8_ != paVar1) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    pcVar14 = extraout_RDX_00;
  }
  if (cVar11.Value == (string *)0x0) {
    local_220._8_8_ = (local_250->_M_dataplus)._M_p;
    local_220._0_8_ = local_250->_M_string_length;
    local_230._0_8_ = (element_type *)0x19;
    local_230._8_8_ = "CMAKE_LINK_LIBRARY_USING_";
    views_01._M_len = 2;
    views_01._M_array = (iterator)local_230;
    cmCatViews_abi_cxx11_((string *)local_280,views_01);
    std::__cxx11::string::operator=((string *)&featureName,(string *)local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ != paVar1) {
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    }
    pcVar2 = this->Makefile;
    local_230._0_8_ = featureName._M_string_length;
    local_230._8_8_ = featureName._M_dataplus._M_p;
    local_220._0_8_ = (cmLocalGenerator *)0xa;
    local_220._8_8_ = (long)"CMAKE_CUDA_PIE_SUPPORTED" + 0xe;
    views_02._M_len = 2;
    views_02._M_array = (iterator)local_230;
    cmCatViews_abi_cxx11_((string *)local_280,views_02);
    cVar11 = cmMakefile::GetDefinition(pcVar2,(string *)local_280);
    pcVar14 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ != paVar1) {
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
      pcVar14 = extraout_RDX_02;
    }
  }
  local_188 = this;
  if ((cVar11.Value == (string *)0x0) ||
     (value._M_str = pcVar14, value._M_len = (size_t)((cVar11.Value)->_M_dataplus)._M_p,
     bVar9 = cmValue::IsOn((cmValue *)(cVar11.Value)->_M_string_length,value), !bVar9)) {
    memset(local_230,0,0xa8);
    psVar13 = local_250;
    local_230._8_8_ = (cmMakefile *)0x0;
    local_220._0_8_ = local_220._0_8_ & 0xffffffffffffff00;
    local_220._16_8_ = local_220._16_8_ & 0xffffffffffffff00;
    local_200._0_8_ = 0;
    local_200._8_8_ = local_200._8_8_ & 0xffffffffffffff00;
    local_1e0 = (_Base_ptr)0x0;
    local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffffffffff00;
    local_1d8._24_8_ = 0;
    local_1b8._M_local_buf[0] = false;
    local_1a8._8_8_ = 0;
    local_198._M_local_buf[0] = '\0';
    local_230._0_8_ = (element_type *)local_220;
    local_220._24_8_ = local_200 + 8;
    local_1f0._8_8_ = local_1d8;
    local_1d8._16_8_ = &local_1b8;
    local_1a8._M_allocated_capacity = (size_type)&local_198;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                *)this_00,local_250,(FeatureDescriptor *)local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_allocated_capacity != &local_198) {
      operator_delete((void *)local_1a8._M_allocated_capacity,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
    }
    pcVar8 = local_188;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._16_8_ != &local_1b8) {
      operator_delete((void *)local_1d8._16_8_,
                      CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1f0._8_8_ != local_1d8) {
      operator_delete((void *)local_1f0._8_8_,(ulong)(local_1d8._0_8_ + 1));
    }
    if ((undefined1 *)local_220._24_8_ != local_200 + 8) {
      operator_delete((void *)local_220._24_8_,local_200._8_8_ + 1);
    }
    if ((element_type *)local_230._0_8_ != (element_type *)local_220) {
      operator_delete((void *)local_230._0_8_,(ulong)(local_220._0_8_ + 1));
    }
    pcVar6 = pcVar8->CMakeInstance;
    pcVar4 = (cmGlobalGenerator *)(psVar13->_M_dataplus)._M_p;
    pcVar5 = (cmLocalGenerator *)psVar13->_M_string_length;
    psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar8->Target);
    local_230._0_8_ = (element_type *)0x9;
    local_230._8_8_ = "Feature \'";
    local_220._16_8_ = (pointer)0x4c;
    local_220._24_8_ =
         "\', specified through generator-expression \'$<LINK_LIBRARY>\' to link target \'";
    local_200._8_8_ = (psVar13->_M_dataplus)._M_p;
    local_200._0_8_ = psVar13->_M_string_length;
    local_1f0._0_8_ = 0x1d;
    local_1f0._8_8_ = "\', is not supported for the \'";
    local_1d8._0_8_ = (pcVar8->LinkLanguage)._M_dataplus._M_p;
    local_1e0 = (_Base_ptr)(pcVar8->LinkLanguage)._M_string_length;
    local_1d8._8_8_ = (_Base_ptr)0x10;
    local_1d8._16_8_ = "\' link language.";
    views_03._M_len = 7;
    views_03._M_array = (iterator)local_230;
    local_220._0_8_ = pcVar5;
    local_220._8_8_ = pcVar4;
    cmCatViews_abi_cxx11_((string *)local_280,views_03);
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_230);
    cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)local_280,(cmListFileBacktrace *)local_230);
  }
  else {
    cVar11 = cmMakefile::GetDefinition(this->Makefile,&featureName);
    if (cVar11.Value != (string *)0x0) {
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_230);
      cmExpandListWithBacktrace(&items,cVar11.Value,(cmListFileBacktrace *)local_230,true);
      if ((cmMakefile *)local_230._8_8_ != (cmMakefile *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._8_8_);
      }
      if ((((long)items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x30) &&
          (bVar9 = anon_unknown.dwarf_1250bb6::IsValidFeatureFormat
                             (&(items.
                                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->Value), !bVar9)) ||
         (((long)items.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)items.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == 0x90 &&
          (bVar9 = anon_unknown.dwarf_1250bb6::IsValidFeatureFormat
                             (&items.
                               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].Value), !bVar9)))) {
        memset(local_230,0,0xa8);
        psVar13 = local_250;
        local_230._8_8_ = (cmMakefile *)0x0;
        local_220._0_8_ = local_220._0_8_ & 0xffffffffffffff00;
        local_220._16_8_ = local_220._16_8_ & 0xffffffffffffff00;
        local_200._0_8_ = 0;
        local_200._8_8_ = local_200._8_8_ & 0xffffffffffffff00;
        local_1e0 = (_Base_ptr)0x0;
        local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffffffffff00;
        local_1d8._24_8_ = 0;
        local_1b8._M_local_buf[0] = false;
        local_1a8._8_8_ = 0;
        local_198._M_local_buf[0] = '\0';
        local_230._0_8_ = (element_type *)local_220;
        local_220._24_8_ = local_200 + 8;
        local_1f0._8_8_ = local_1d8;
        local_1d8._16_8_ = &local_1b8;
        local_1a8._M_allocated_capacity = (size_type)&local_198;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                    *)this_00,local_250,(FeatureDescriptor *)local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_allocated_capacity != &local_198) {
          operator_delete((void *)local_1a8._M_allocated_capacity,
                          CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0])
                          + 1);
        }
        pcVar8 = local_188;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._16_8_ != &local_1b8) {
          operator_delete((void *)local_1d8._16_8_,
                          CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0])
                          + 1);
        }
        if ((undefined1 *)local_1f0._8_8_ != local_1d8) {
          operator_delete((void *)local_1f0._8_8_,(ulong)(local_1d8._0_8_ + 1));
        }
        if ((undefined1 *)local_220._24_8_ != local_200 + 8) {
          operator_delete((void *)local_220._24_8_,local_200._8_8_ + 1);
        }
        if ((element_type *)local_230._0_8_ != (element_type *)local_220) {
          operator_delete((void *)local_230._0_8_,(ulong)(local_220._0_8_ + 1));
        }
        pcVar6 = pcVar8->CMakeInstance;
        pcVar4 = (cmGlobalGenerator *)(psVar13->_M_dataplus)._M_p;
        pcVar5 = (cmLocalGenerator *)psVar13->_M_string_length;
        psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar8->Target);
        local_230._0_8_ = (element_type *)0x9;
        local_230._8_8_ = "Feature \'";
        local_220._16_8_ = (pointer)0x1a;
        local_220._24_8_ = "\', specified by variable \'";
        local_200._0_8_ = featureName._M_string_length;
        local_200._8_8_ = featureName._M_dataplus._M_p;
        local_1f0._0_8_ = 0x76;
        local_1f0._8_8_ =
             "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing) and cannot be used to link target \'"
        ;
        local_1d8._0_8_ = (psVar13->_M_dataplus)._M_p;
        local_1e0 = (_Base_ptr)psVar13->_M_string_length;
        local_1d8._8_8_ = &DAT_00000002;
        local_1d8._16_8_ = (long)"\nmay not start with \'-\'." + 0x16;
        views_05._M_len = 7;
        views_05._M_array = (iterator)local_230;
        local_220._0_8_ = pcVar5;
        local_220._8_8_ = pcVar4;
        cmCatViews_abi_cxx11_((string *)local_280,views_05);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_230);
        cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)local_280,(cmListFileBacktrace *)local_230)
        ;
joined_r0x003674c0:
        if ((cmMakefile *)local_230._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._8_8_);
        }
        local_140._M_allocated_capacity = local_280._16_8_;
        local_150._M_allocated_capacity = local_280._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_280 + 0x10)) {
LAB_00367c80:
          operator_delete((void *)local_150._M_allocated_capacity,
                          local_140._M_allocated_capacity + 1);
        }
LAB_00367c88:
        bVar9 = false;
      }
      else {
        lVar12 = ((long)items.
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)items.
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
        local_280._0_8_ = paVar1;
        if (lVar12 != 3) {
          if (lVar12 == 1) {
            std::
            vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back(&items,items.
                               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
            pBVar7 = items.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_230._0_8_ = (element_type *)local_220;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"PATH{","");
            std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"NAME{","");
            anon_unknown.dwarf_1250bb6::FinalizeFeatureFormat
                      (&pBVar7->Value,(string *)local_230,(string *)local_280);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._0_8_ != paVar1) {
              operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
            }
            if ((element_type *)local_230._0_8_ != (element_type *)local_220) {
              operator_delete((void *)local_230._0_8_,(ulong)(local_220._0_8_ + 1));
            }
            pBVar7 = items.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_230._0_8_ = (element_type *)local_220;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"NAME{","");
            local_280._0_8_ = paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"PATH{","");
            anon_unknown.dwarf_1250bb6::FinalizeFeatureFormat
                      (&pBVar7[1].Value,(string *)local_230,(string *)local_280);
            goto LAB_003675b2;
          }
          memset((FeatureDescriptor *)local_230,0,0xa8);
          psVar13 = local_250;
          local_230._0_8_ = local_220;
          local_230._8_8_ = (cmMakefile *)0x0;
          local_220._0_8_ = local_220._0_8_ & 0xffffffffffffff00;
          local_220._16_8_ = local_220._16_8_ & 0xffffffffffffff00;
          local_220._24_8_ = local_200 + 8;
          local_200._0_8_ = 0;
          local_200._8_8_ = local_200._8_8_ & 0xffffffffffffff00;
          local_1f0._8_8_ = local_1d8;
          local_1e0 = (_Base_ptr)0x0;
          local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffffffffff00;
          local_1d8._16_8_ = &local_1b8;
          local_1d8._24_8_ = 0;
          local_1b8._M_local_buf[0] = false;
          local_1a8._M_allocated_capacity = (size_type)&local_198;
          local_1a8._8_8_ = 0;
          local_198._M_local_buf[0] = '\0';
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00,local_250,(FeatureDescriptor *)local_230);
          FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_230);
          pcVar6 = this->CMakeInstance;
          local_230._0_8_ = (element_type *)0x9;
          local_230._8_8_ = "Feature \'";
          local_280._8_8_ = (psVar13->_M_dataplus)._M_p;
          local_280._0_8_ = psVar13->_M_string_length;
          psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          cmStrCat<char[27],std::__cxx11::string,char[79],std::__cxx11::string,char[3]>
                    ((string *)&local_150,(cmAlphaNum *)local_230,(cmAlphaNum *)local_280,
                     (char (*) [27])"\', specified by variable \'",&featureName,
                     (char (*) [79])
                     "\', is malformed (wrong number of elements) and cannot be used to link target \'"
                     ,psVar13,(char (*) [3])0x7a4b0c);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_180);
          cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)&local_150,
                              (cmListFileBacktrace *)local_180);
joined_r0x003678f7:
          if ((cmMakefile *)local_180._8_8_ != (cmMakefile *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_allocated_capacity != &local_140) goto LAB_00367c80;
          goto LAB_00367c88;
        }
        std::
        vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::insert(&items,items.
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1,
                 (value_type *)
                 (items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1));
        pBVar7 = items.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_230._0_8_ = (element_type *)local_220;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"PATH{","");
        std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"NAME{","");
        anon_unknown.dwarf_1250bb6::FinalizeFeatureFormat
                  (&pBVar7[1].Value,(string *)local_230,(string *)local_280);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._0_8_ != paVar1) {
          operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
        }
        if ((element_type *)local_230._0_8_ != (element_type *)local_220) {
          operator_delete((void *)local_230._0_8_,(ulong)(local_220._0_8_ + 1));
        }
        pBVar7 = items.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_230._0_8_ = (element_type *)local_220;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"NAME{","");
        local_280._0_8_ = paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"PATH{","");
        anon_unknown.dwarf_1250bb6::FinalizeFeatureFormat
                  (&pBVar7[2].Value,(string *)local_230,(string *)local_280);
LAB_003675b2:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._0_8_ != paVar1) {
          operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
        }
        if ((element_type *)local_230._0_8_ != (element_type *)local_220) {
          operator_delete((void *)local_230._0_8_,(ulong)(local_220._0_8_ + 1));
        }
        if ((((long)items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x60) &&
            (bVar9 = anon_unknown.dwarf_1250bb6::IsValidFeatureFormat
                               (&(items.
                                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->Value), !bVar9)) ||
           (((long)items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == 0xc0 &&
            (bVar9 = anon_unknown.dwarf_1250bb6::IsValidFeatureFormat
                               (&items.
                                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].Value), !bVar9)))) {
          memset(local_230,0,0xa8);
          psVar13 = local_250;
          local_230._8_8_ = (cmMakefile *)0x0;
          local_220._0_8_ = local_220._0_8_ & 0xffffffffffffff00;
          local_220._16_8_ = local_220._16_8_ & 0xffffffffffffff00;
          local_200._0_8_ = 0;
          local_200._8_8_ = local_200._8_8_ & 0xffffffffffffff00;
          local_1e0 = (_Base_ptr)0x0;
          local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffffffffff00;
          local_1d8._24_8_ = 0;
          local_1b8._M_local_buf[0] = false;
          local_1a8._8_8_ = 0;
          local_198._M_local_buf[0] = '\0';
          local_230._0_8_ = (element_type *)local_220;
          local_220._24_8_ = local_200 + 8;
          local_1f0._8_8_ = local_1d8;
          local_1d8._16_8_ = &local_1b8;
          local_1a8._M_allocated_capacity = (size_type)&local_198;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00,local_250,(FeatureDescriptor *)local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_allocated_capacity != &local_198) {
            operator_delete((void *)local_1a8._M_allocated_capacity,
                            CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]
                                    ) + 1);
          }
          pcVar8 = local_188;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._16_8_ != &local_1b8) {
            operator_delete((void *)local_1d8._16_8_,
                            CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]
                                    ) + 1);
          }
          if ((undefined1 *)local_1f0._8_8_ != local_1d8) {
            operator_delete((void *)local_1f0._8_8_,(ulong)(local_1d8._0_8_ + 1));
          }
          if ((undefined1 *)local_220._24_8_ != local_200 + 8) {
            operator_delete((void *)local_220._24_8_,local_200._8_8_ + 1);
          }
          if ((element_type *)local_230._0_8_ != (element_type *)local_220) {
            operator_delete((void *)local_230._0_8_,(ulong)(local_220._0_8_ + 1));
          }
          pcVar6 = pcVar8->CMakeInstance;
          pcVar4 = (cmGlobalGenerator *)(psVar13->_M_dataplus)._M_p;
          pcVar5 = (cmLocalGenerator *)psVar13->_M_string_length;
          psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar8->Target);
          local_230._0_8_ = (element_type *)0x9;
          local_230._8_8_ = "Feature \'";
          local_220._16_8_ = (pointer)0x1a;
          local_220._24_8_ = "\', specified by variable \'";
          local_200._0_8_ = featureName._M_string_length;
          local_200._8_8_ = featureName._M_dataplus._M_p;
          local_1f0._0_8_ = 0x8f;
          local_1f0._8_8_ =
               "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing for \"PATH{}\" alternative) and cannot be used to link target \'"
          ;
          local_1d8._0_8_ = (psVar13->_M_dataplus)._M_p;
          local_1e0 = (_Base_ptr)psVar13->_M_string_length;
          local_1d8._8_8_ = &DAT_00000002;
          local_1d8._16_8_ = (long)"\nmay not start with \'-\'." + 0x16;
          views_06._M_len = 7;
          views_06._M_array = (iterator)local_230;
          local_220._0_8_ = pcVar5;
          local_220._8_8_ = pcVar4;
          cmCatViews_abi_cxx11_((string *)local_280,views_06);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_230);
          cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)local_280,
                              (cmListFileBacktrace *)local_230);
          goto joined_r0x003674c0;
        }
        if ((((long)items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)items.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x60) &&
            (bVar9 = anon_unknown.dwarf_1250bb6::IsValidFeatureFormat
                               (&items.
                                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].Value), !bVar9)) ||
           (((long)items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == 0xc0 &&
            (bVar9 = anon_unknown.dwarf_1250bb6::IsValidFeatureFormat
                               (&items.
                                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[2].Value), !bVar9)))) {
          memset((FeatureDescriptor *)local_230,0,0xa8);
          psVar13 = local_250;
          local_230._0_8_ = local_220;
          local_230._8_8_ = (cmMakefile *)0x0;
          local_220._0_8_ = local_220._0_8_ & 0xffffffffffffff00;
          local_220._16_8_ = local_220._16_8_ & 0xffffffffffffff00;
          local_220._24_8_ = local_200 + 8;
          local_200._0_8_ = 0;
          local_200._8_8_ = local_200._8_8_ & 0xffffffffffffff00;
          local_1f0._8_8_ = local_1d8;
          local_1e0 = (_Base_ptr)0x0;
          local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffffffffff00;
          local_1d8._16_8_ = &local_1b8;
          local_1d8._24_8_ = 0;
          local_1b8._M_local_buf[0] = false;
          local_1a8._M_allocated_capacity = (size_type)&local_198;
          local_1a8._8_8_ = 0;
          local_198._M_local_buf[0] = '\0';
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00,local_250,(FeatureDescriptor *)local_230);
          FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_230);
          pcVar6 = this->CMakeInstance;
          local_230._0_8_ = (element_type *)0x9;
          local_230._8_8_ = "Feature \'";
          local_280._8_8_ = (psVar13->_M_dataplus)._M_p;
          local_280._0_8_ = psVar13->_M_string_length;
          psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          cmStrCat<char[27],std::__cxx11::string,char[144],std::__cxx11::string,char[3]>
                    ((string *)&local_150,(cmAlphaNum *)local_230,(cmAlphaNum *)local_280,
                     (char (*) [27])"\', specified by variable \'",&featureName,
                     (char (*) [144])
                     "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing for \"NAME{}\" alternative) and cannot be used to link target \'"
                     ,psVar13,(char (*) [3])0x7a4b0c);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_180);
          cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)&local_150,
                              (cmListFileBacktrace *)local_180);
          goto joined_r0x003678f7;
        }
        cmGeneratorTarget::ResolveLinkerWrapper(this->Target,&items,&this->LinkLanguage,true);
        if ((long)items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)items.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x60) {
          pcVar3 = (local_250->_M_dataplus)._M_p;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar3,pcVar3 + local_250->_M_string_length);
          pcVar3 = ((items.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->Value)._M_dataplus._M_p;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar3,
                     pcVar3 + ((items.
                                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->Value)._M_string_length)
          ;
          pcVar3 = items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].Value._M_dataplus._M_p;
          local_90._0_8_ = (_Base_ptr)(local_90 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_90,pcVar3,
                     pcVar3 + items.
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].Value._M_string_length);
          LibraryFeatureDescriptor::LibraryFeatureDescriptor
                    ((LibraryFeatureDescriptor *)local_230,&local_50,&local_70,(string *)local_90);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::LibraryFeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00,local_250,(LibraryFeatureDescriptor *)local_230);
          FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_230);
          if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)(local_90 + 0x10)) {
            operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          local_b0.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
          _Var15._M_p = local_50._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00367e4b:
            operator_delete(_Var15._M_p,
                            (ulong)((long)&((_Base_ptr)local_b0.field_2._M_allocated_capacity)->
                                           _M_color + 1));
          }
        }
        else {
          pcVar3 = (local_250->_M_dataplus)._M_p;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar3,pcVar3 + local_250->_M_string_length);
          local_130._0_8_ = local_130 + 0x10;
          pcVar3 = ((items.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->Value)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_130,pcVar3,
                     pcVar3 + ((items.
                                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->Value)._M_string_length)
          ;
          pcVar3 = items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].Value._M_dataplus._M_p;
          local_d0._0_8_ = (_Base_ptr)(local_d0 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d0,pcVar3,
                     pcVar3 + items.
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].Value._M_string_length);
          pcVar3 = items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2].Value._M_dataplus._M_p;
          local_f0._0_8_ = (_Base_ptr)(local_f0 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f0,pcVar3,
                     pcVar3 + items.
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2].Value._M_string_length);
          pcVar3 = items.
                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3].Value._M_dataplus._M_p;
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,pcVar3,
                     pcVar3 + items.
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[3].Value._M_string_length);
          LibraryFeatureDescriptor::LibraryFeatureDescriptor
                    ((LibraryFeatureDescriptor *)local_230,&local_b0,(string *)local_130,
                     (string *)local_d0,(string *)local_f0,&local_110);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::
          _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::LibraryFeatureDescriptor>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)this_00,local_250,(LibraryFeatureDescriptor *)local_230);
          FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((_Base_ptr)local_f0._0_8_ != (_Base_ptr)(local_f0 + 0x10)) {
            operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
          }
          if ((_Base_ptr)local_d0._0_8_ != (_Base_ptr)(local_d0 + 0x10)) {
            operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
          }
          if ((_Base_ptr)local_130._0_8_ != (_Base_ptr)(local_130 + 0x10)) {
            operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
          }
          _Var15._M_p = local_b0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) goto LAB_00367e4b;
        }
        bVar9 = true;
      }
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&items);
      goto LAB_00367088;
    }
    memset(local_230,0,0xa8);
    psVar13 = local_250;
    local_230._8_8_ = (cmMakefile *)0x0;
    local_220._0_8_ = local_220._0_8_ & 0xffffffffffffff00;
    local_220._16_8_ = local_220._16_8_ & 0xffffffffffffff00;
    local_200._0_8_ = 0;
    local_200._8_8_ = local_200._8_8_ & 0xffffffffffffff00;
    local_1e0 = (_Base_ptr)0x0;
    local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffffffffff00;
    local_1d8._24_8_ = 0;
    local_1b8._M_local_buf[0] = false;
    local_1a8._8_8_ = 0;
    local_198._M_local_buf[0] = '\0';
    local_230._0_8_ = (element_type *)local_220;
    local_220._24_8_ = local_200 + 8;
    local_1f0._8_8_ = local_1d8;
    local_1d8._16_8_ = &local_1b8;
    local_1a8._M_allocated_capacity = (size_type)&local_198;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                *)this_00,local_250,(FeatureDescriptor *)local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_allocated_capacity != &local_198) {
      operator_delete((void *)local_1a8._M_allocated_capacity,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
    }
    pcVar8 = local_188;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._16_8_ != &local_1b8) {
      operator_delete((void *)local_1d8._16_8_,
                      CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1f0._8_8_ != local_1d8) {
      operator_delete((void *)local_1f0._8_8_,(ulong)(local_1d8._0_8_ + 1));
    }
    if ((undefined1 *)local_220._24_8_ != local_200 + 8) {
      operator_delete((void *)local_220._24_8_,local_200._8_8_ + 1);
    }
    if ((element_type *)local_230._0_8_ != (element_type *)local_220) {
      operator_delete((void *)local_230._0_8_,(ulong)(local_220._0_8_ + 1));
    }
    pcVar6 = pcVar8->CMakeInstance;
    pcVar4 = (cmGlobalGenerator *)(psVar13->_M_dataplus)._M_p;
    pcVar5 = (cmLocalGenerator *)psVar13->_M_string_length;
    psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar8->Target);
    local_230._0_8_ = (element_type *)0x9;
    local_230._8_8_ = "Feature \'";
    local_220._16_8_ = (pointer)0x4c;
    local_220._24_8_ =
         "\', specified through generator-expression \'$<LINK_LIBRARY>\' to link target \'";
    local_200._8_8_ = (psVar13->_M_dataplus)._M_p;
    local_200._0_8_ = psVar13->_M_string_length;
    local_1f0._0_8_ = 0x1b;
    local_1f0._8_8_ = "\', is not defined for the \'";
    local_1d8._0_8_ = (pcVar8->LinkLanguage)._M_dataplus._M_p;
    local_1e0 = (_Base_ptr)(pcVar8->LinkLanguage)._M_string_length;
    local_1d8._8_8_ = (_Base_ptr)0x10;
    local_1d8._16_8_ = "\' link language.";
    views_04._M_len = 7;
    views_04._M_array = (iterator)local_230;
    local_220._0_8_ = pcVar5;
    local_220._8_8_ = pcVar4;
    cmCatViews_abi_cxx11_((string *)local_280,views_04);
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_230);
    cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)local_280,(cmListFileBacktrace *)local_230);
  }
  if ((cmMakefile *)local_230._8_8_ != (cmMakefile *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_280 + 0x10)) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  bVar9 = false;
LAB_00367088:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)featureName._M_dataplus._M_p != &featureName.field_2) {
    operator_delete(featureName._M_dataplus._M_p,featureName.field_2._M_allocated_capacity + 1);
  }
  return bVar9;
}

Assistant:

bool cmComputeLinkInformation::AddLibraryFeature(std::string const& feature)
{
  auto it = this->LibraryFeatureDescriptors.find(feature);
  if (it != this->LibraryFeatureDescriptors.end()) {
    return it->second.Supported;
  }

  auto featureName =
    cmStrCat("CMAKE_", this->LinkLanguage, "_LINK_LIBRARY_USING_", feature);
  cmValue featureSupported =
    this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  if (!featureSupported) {
    // language specific variable is not defined, fallback to the more generic
    // one
    featureName = cmStrCat("CMAKE_LINK_LIBRARY_USING_", feature);
    featureSupported =
      this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  }
  if (!featureSupported.IsOn()) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});

    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Feature '", feature,
        "', specified through generator-expression '$<LINK_LIBRARY>' to "
        "link target '",
        this->Target->GetName(), "', is not supported for the '",
        this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());

    return false;
  }

  cmValue langFeature = this->Makefile->GetDefinition(featureName);
  if (!langFeature) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});

    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Feature '", feature,
        "', specified through generator-expression '$<LINK_LIBRARY>' to "
        "link target '",
        this->Target->GetName(), "', is not defined for the '",
        this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());

    return false;
  }

  auto items =
    cmExpandListWithBacktrace(langFeature, this->Target->GetBacktrace(), true);

  if ((items.size() == 1 && !IsValidFeatureFormat(items.front().Value)) ||
      (items.size() == 3 && !IsValidFeatureFormat(items[1].Value))) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing) and cannot be used to link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }

  // now, handle possible "PATH{}" and "NAME{}" patterns
  if (items.size() == 1) {
    items.push_back(items.front());
    FinalizeFeatureFormat(items[0].Value, "PATH{", "NAME{");
    FinalizeFeatureFormat(items[1].Value, "NAME{", "PATH{");
  } else if (items.size() == 3) {
    items.insert(items.begin() + 1, items[1]);
    FinalizeFeatureFormat(items[1].Value, "PATH{", "NAME{");
    FinalizeFeatureFormat(items[2].Value, "NAME{", "PATH{");
  } else {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (wrong number of elements) and cannot be used "
               "to link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }
  if ((items.size() == 2 && !IsValidFeatureFormat(items[0].Value)) ||
      (items.size() == 4 && !IsValidFeatureFormat(items[1].Value))) {
    // PATH{} has wrong format
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing for \"PATH{}\" alternative) and cannot be used to "
               "link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }
  if ((items.size() == 2 && !IsValidFeatureFormat(items[1].Value)) ||
      (items.size() == 4 && !IsValidFeatureFormat(items[2].Value))) {
    // NAME{} has wrong format
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing for \"NAME{}\" alternative) and cannot be used to "
               "link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }

  // replace LINKER: pattern
  this->Target->ResolveLinkerWrapper(items, this->LinkLanguage, true);

  if (items.size() == 2) {
    this->LibraryFeatureDescriptors.emplace(
      feature,
      LibraryFeatureDescriptor{ feature, items[0].Value, items[1].Value });
  } else {
    this->LibraryFeatureDescriptors.emplace(
      feature,
      LibraryFeatureDescriptor{ feature, items[0].Value, items[1].Value,
                                items[2].Value, items[3].Value });
  }

  return true;
}